

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t read_mac_metadata_blob
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  size_t min;
  void *p_00;
  wchar_t *local_70;
  wchar_t *wname;
  wchar_t *wp;
  char *name;
  char *p;
  void *data;
  size_t msize;
  int64_t size;
  size_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_70 = archive_entry_pathname_w(entry);
  wname = local_70;
  if (local_70 == (wchar_t *)0x0) {
    wp = (wchar_t *)archive_entry_pathname(entry);
    name = (char *)wp;
    if (wp == (wchar_t *)0x0) {
      return L'\xffffffe7';
    }
    for (; *name != '\0'; name = name + 1) {
      if ((*name == '/') && (name[1] != '\0')) {
        wp = (wchar_t *)(name + 1);
      }
    }
    if ((((char)*wp != '.') || (*(char *)((long)wp + 1) != '_')) ||
       (*(char *)((long)wp + 2) == '\0')) {
      return L'\0';
    }
  }
  else {
    for (; *wname != L'\0'; wname = wname + 1) {
      if ((*wname == L'/') && (wname[1] != L'\0')) {
        local_70 = wname + 1;
      }
    }
    if (((*local_70 != L'.') || (local_70[1] != L'_')) || (local_70[2] == L'\0')) {
      return L'\0';
    }
  }
  min = archive_entry_size(entry);
  if ((long)min < 0) {
    *unconsumed = 0;
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    p_00 = __archive_read_ahead(a,min,(ssize_t *)0x0);
    if (p_00 == (void *)0x0) {
      *unconsumed = 0;
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      archive_entry_copy_mac_metadata(entry,p_00,min);
      *unconsumed = min + 0x1ff & 0xfffffffffffffe00;
      tar_flush_unconsumed(a,unconsumed);
      a_local._4_4_ = tar_read_header(a,tar,entry,unconsumed);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_mac_metadata_blob(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int64_t size;
	size_t msize;
	const void *data;
	const char *p, *name;
	const wchar_t *wp, *wname;

	(void)h; /* UNUSED */

	wname = wp = archive_entry_pathname_w(entry);
	if (wp != NULL) {
		/* Find the last path element. */
		for (; *wp != L'\0'; ++wp) {
			if (wp[0] == '/' && wp[1] != L'\0')
				wname = wp + 1;
		}
		/*
		 * If last path element starts with "._", then
		 * this is a Mac extension.
		 */
		if (wname[0] != L'.' || wname[1] != L'_' || wname[2] == L'\0')
			return ARCHIVE_OK;
	} else {
		/* Find the last path element. */
		name = p = archive_entry_pathname(entry);
		if (p == NULL)
			return (ARCHIVE_FAILED);
		for (; *p != '\0'; ++p) {
			if (p[0] == '/' && p[1] != '\0')
				name = p + 1;
		}
		/*
		 * If last path element starts with "._", then
		 * this is a Mac extension.
		 */
		if (name[0] != '.' || name[1] != '_' || name[2] == '\0')
			return ARCHIVE_OK;
	}

 	/* Read the body as a Mac OS metadata blob. */
	size = archive_entry_size(entry);
	msize = (size_t)size;
	if (size < 0 || (uintmax_t)msize != (uintmax_t)size) {
		*unconsumed = 0;
		return (ARCHIVE_FATAL);
	}

	/*
	 * TODO: Look beyond the body here to peek at the next header.
	 * If it's a regular header (not an extension header)
	 * that has the wrong name, just return the current
	 * entry as-is, without consuming the body here.
	 * That would reduce the risk of us mis-identifying
	 * an ordinary file that just happened to have
	 * a name starting with "._".
	 *
	 * Q: Is the above idea really possible?  Even
	 * when there are GNU or pax extension entries?
	 */
	data = __archive_read_ahead(a, msize, NULL);
	if (data == NULL) {
		*unconsumed = 0;
		return (ARCHIVE_FATAL);
	}
	archive_entry_copy_mac_metadata(entry, data, msize);
	*unconsumed = (msize + 511) & ~ 511;
	tar_flush_unconsumed(a, unconsumed);
	return (tar_read_header(a, tar, entry, unconsumed));
}